

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi.cpp
# Opt level: O3

void __thiscall curlpp::Multi::fdset(Multi *this,fd_set *read,fd_set *write,fd_set *exc,int *max)

{
  int iVar1;
  RuntimeError *this_00;
  char *reason;
  
  iVar1 = curl_multi_fdset(this->mMultiHandle);
  if (0xfffffffd < iVar1 - 1U) {
    return;
  }
  this_00 = (RuntimeError *)__cxa_allocate_exception(0x10);
  reason = (char *)curl_multi_strerror(iVar1);
  RuntimeError::RuntimeError(this_00,reason);
  __cxa_throw(this_00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

void
curlpp::Multi::fdset(fd_set * read, fd_set * write, fd_set * exc, int * max)
{
  CURLMcode code = curl_multi_fdset(mMultiHandle, read, write, exc, max);
  if(code != CURLM_CALL_MULTI_PERFORM) {
    if(code != CURLM_OK) {
      throw curlpp::RuntimeError(curl_multi_strerror(code));
    }
  }
}